

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qprogressbar.cpp
# Opt level: O2

void QProgressBar::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QString *format;
  byte *pbVar1;
  qsizetype qVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  byte bVar5;
  undefined4 uVar6;
  int iVar7;
  Orientation orientation;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        valueChanged((QProgressBar *)_o,*_a[1]);
        return;
      }
      break;
    case 1:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        reset((QProgressBar *)_o);
        return;
      }
      break;
    case 2:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setRange((QProgressBar *)_o,*_a[1],*_a[2]);
        return;
      }
      break;
    case 3:
      iVar7 = *_a[1];
LAB_00430a72:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setMinimum((QProgressBar *)_o,iVar7);
        return;
      }
      break;
    case 4:
      iVar7 = *_a[1];
LAB_00430b14:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setMaximum((QProgressBar *)_o,iVar7);
        return;
      }
      break;
    case 5:
      iVar7 = *_a[1];
LAB_00430aca:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setValue((QProgressBar *)_o,iVar7);
        return;
      }
      break;
    case 6:
      orientation = *_a[1];
LAB_00430aef:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setOrientation((QProgressBar *)_o,orientation);
        return;
      }
      break;
    default:
      goto switchD_0043099b_caseD_2;
    }
    goto LAB_00430cba;
  case ReadProperty:
    if (9 < (uint)_id) break;
    pbVar1 = (byte *)*_a;
    switch(_id) {
    case 0:
      uVar6 = *(undefined4 *)(*(long *)(_o + 8) + 0x254);
      break;
    case 1:
      uVar6 = *(undefined4 *)(*(long *)(_o + 8) + 600);
      break;
    case 2:
      (**(code **)(*(long *)_o + 0x1a0))(&local_38,_o);
      goto LAB_00430c25;
    case 3:
      uVar6 = *(undefined4 *)(*(long *)(_o + 8) + 0x25c);
      break;
    case 4:
      uVar6 = *(undefined4 *)(*(long *)(_o + 8) + 0x260);
      break;
    case 5:
      bVar5 = *(byte *)(*(long *)(_o + 8) + 0x264) & 1;
      goto LAB_00430c84;
    case 6:
      uVar6 = *(undefined4 *)(*(long *)(_o + 8) + 0x26c);
      break;
    case 7:
      bVar5 = *(byte *)(*(long *)(_o + 8) + 0x270);
LAB_00430c84:
      *pbVar1 = bVar5;
      goto switchD_0043099b_caseD_2;
    case 8:
      uVar6 = *(undefined4 *)(*(long *)(_o + 8) + 0x274);
      break;
    case 9:
      QProgressBar::format((QString *)&local_38,(QProgressBar *)_o);
LAB_00430c25:
      pDVar3 = *(Data **)pbVar1;
      pcVar4 = *(char16_t **)(pbVar1 + 8);
      *(Data **)pbVar1 = local_38.d;
      *(char16_t **)(pbVar1 + 8) = local_38.ptr;
      qVar2 = *(qsizetype *)(pbVar1 + 0x10);
      *(qsizetype *)(pbVar1 + 0x10) = local_38.size;
      local_38.d = pDVar3;
      local_38.ptr = pcVar4;
      local_38.size = qVar2;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
      goto switchD_0043099b_caseD_2;
    }
    *(undefined4 *)pbVar1 = uVar6;
    break;
  case WriteProperty:
    if ((uint)_id < 10) {
      format = (QString *)*_a;
      switch(_id) {
      case 0:
        iVar7 = *(int *)&(format->d).d;
        goto LAB_00430a72;
      case 1:
        iVar7 = *(int *)&(format->d).d;
        goto LAB_00430b14;
      case 2:
        goto switchD_0043099b_caseD_2;
      case 3:
        iVar7 = *(int *)&(format->d).d;
        goto LAB_00430aca;
      case 4:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setAlignment((QProgressBar *)_o,
                       (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)
                       *(QFlagsStorageHelper<Qt::AlignmentFlag,_4> *)&(format->d).d);
          return;
        }
        break;
      case 5:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setTextVisible((QProgressBar *)_o,*(bool *)&(format->d).d);
          return;
        }
        break;
      case 6:
        orientation = *(Orientation *)&(format->d).d;
        goto LAB_00430aef;
      case 7:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setInvertedAppearance((QProgressBar *)_o,*(bool *)&(format->d).d);
          return;
        }
        break;
      case 8:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setTextDirection((QProgressBar *)_o,*(Direction *)&(format->d).d);
          return;
        }
        break;
      case 9:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setFormat((QProgressBar *)_o,format);
          return;
        }
      }
      goto LAB_00430cba;
    }
    break;
  default:
    if (_id == 9 && _c == ResetProperty) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        resetFormat((QProgressBar *)_o);
        return;
      }
      goto LAB_00430cba;
    }
    break;
  case IndexOfMethod:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      QtMocHelpers::indexOfMethod<void(QProgressBar::*)(int)>
                ((QtMocHelpers *)_a,(void **)valueChanged,0,0);
      return;
    }
    goto LAB_00430cba;
  }
switchD_0043099b_caseD_2:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
LAB_00430cba:
  __stack_chk_fail();
}

Assistant:

void QProgressBar::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QProgressBar *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->valueChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 1: _t->reset(); break;
        case 2: _t->setRange((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 3: _t->setMinimum((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 4: _t->setMaximum((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 5: _t->setValue((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 6: _t->setOrientation((*reinterpret_cast< std::add_pointer_t<Qt::Orientation>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QProgressBar::*)(int )>(_a, &QProgressBar::valueChanged, 0))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<int*>(_v) = _t->minimum(); break;
        case 1: *reinterpret_cast<int*>(_v) = _t->maximum(); break;
        case 2: *reinterpret_cast<QString*>(_v) = _t->text(); break;
        case 3: *reinterpret_cast<int*>(_v) = _t->value(); break;
        case 4: *reinterpret_cast<Qt::Alignment*>(_v) = _t->alignment(); break;
        case 5: *reinterpret_cast<bool*>(_v) = _t->isTextVisible(); break;
        case 6: *reinterpret_cast<Qt::Orientation*>(_v) = _t->orientation(); break;
        case 7: *reinterpret_cast<bool*>(_v) = _t->invertedAppearance(); break;
        case 8: *reinterpret_cast<Direction*>(_v) = _t->textDirection(); break;
        case 9: *reinterpret_cast<QString*>(_v) = _t->format(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setMinimum(*reinterpret_cast<int*>(_v)); break;
        case 1: _t->setMaximum(*reinterpret_cast<int*>(_v)); break;
        case 3: _t->setValue(*reinterpret_cast<int*>(_v)); break;
        case 4: _t->setAlignment(*reinterpret_cast<Qt::Alignment*>(_v)); break;
        case 5: _t->setTextVisible(*reinterpret_cast<bool*>(_v)); break;
        case 6: _t->setOrientation(*reinterpret_cast<Qt::Orientation*>(_v)); break;
        case 7: _t->setInvertedAppearance(*reinterpret_cast<bool*>(_v)); break;
        case 8: _t->setTextDirection(*reinterpret_cast<Direction*>(_v)); break;
        case 9: _t->setFormat(*reinterpret_cast<QString*>(_v)); break;
        default: break;
        }
    }
if (_c == QMetaObject::ResetProperty) {
        switch (_id) {
        case 9: _t->resetFormat(); break;
        default: break;
        }
    }
}